

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# live.cc
# Opt level: O2

void __thiscall
pstack::Procman::LiveReader::LiveReader(LiveReader *this,Context *c,pid_t pid,string *base)

{
  string local_40 [32];
  
  pstack::Context::procname((int)local_40,(string *)c);
  pstack::FileReader::FileReader(&this->super_FileReader,c,local_40);
  std::__cxx11::string::~string(local_40);
  *(undefined ***)this = &PTR__FileReader_00151228;
  *(undefined8 *)&this->field_0x40 = 0xffffffffffffffff;
  return;
}

Assistant:

LiveReader::LiveReader(Context &c, pid_t pid, const std::string &base) : FileReader(c, c.procname(pid, base)) {
   fileSize = std::numeric_limits<Reader::Off>::max();
}